

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readDistribution.hpp
# Opt level: O2

Distribution * __thiscall
njoy::ENDFtk::section::Type<26>::ReactionProduct::
readDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Distribution *__return_storage_ptr__,ReactionProduct *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LAW,long lineLaw)

{
  undefined8 *puVar1;
  int MAT_00;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  TabulationRecord local_a8;
  
  MAT_00 = (int)lineNumber;
  if (MT == 8) {
    EnergyTransfer::EnergyTransfer<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((EnergyTransfer *)&local_a8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    ::
    variant<njoy::ENDFtk::section::Type<26>::EnergyTransfer,void,void,njoy::ENDFtk::section::Type<26>::EnergyTransfer,void>
              ((variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                *)__return_storage_ptr__,(EnergyTransfer *)&local_a8);
    TabulationRecord::~TabulationRecord(&local_a8);
  }
  else if (MT == 2) {
    DiscreteTwoBodyScattering::
    DiscreteTwoBodyScattering<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((DiscreteTwoBodyScattering *)&local_a8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    ::
    variant<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,void,void,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,void>
              ((variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                *)__return_storage_ptr__,(DiscreteTwoBodyScattering *)&local_a8);
    InterpolationSequenceRecord<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution>
    ::~InterpolationSequenceRecord
              ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution>
                *)&local_a8);
  }
  else {
    if (MT != 1) {
      tools::Log::error<char_const*>
                ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      tools::Log::info<char_const*>
                ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      tools::Log::info<char_const*,int>("LAW value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",CONCAT44(in_stack_0000001c,LAW) + -1);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    ContinuumEnergyAngle::
    ContinuumEnergyAngle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ContinuumEnergyAngle *)&local_a8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    ::
    variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,void,void,njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,void>
              ((variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                *)__return_storage_ptr__,(ContinuumEnergyAngle *)&local_a8);
    InterpolationSequenceRecord<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>
    ::~InterpolationSequenceRecord
              ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>
                *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

static Distribution
readDistribution( Iterator& begin,
                  const Iterator& end,
                  long& lineNumber,
                  int MAT,
                  int MF,
                  int MT,
                  int LAW,
                  long lineLaw ) {
  switch ( LAW ) {
    case   1 : return ContinuumEnergyAngle(
                        begin, end, lineNumber, MAT, MF, MT );
    case   2 : return DiscreteTwoBodyScattering(
                        begin, end, lineNumber, MAT, MF, MT );
    case   8 : return EnergyTransfer( begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LAW value" );
      Log::info( "LAW is equal to 1, 2 or 8" );
      Log::info( "LAW value: {}", LAW );
      Log::info( "Line number: {}", lineLaw - 1 );
      throw std::exception();
    }
  }
}